

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendForPipelineInternal(RpcRequest *this)

{
  RpcConnectionState *this_00;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar1;
  long lVar2;
  long *plVar3;
  uint *puVar4;
  Builder payload;
  Question *this_01;
  QuestionRef *extraout_RDX;
  long in_RSI;
  ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> capTable;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> OVar5;
  QuestionId questionId;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> questionRef;
  UnwindDetector _kjUnwindDetector2673;
  Vector<int> fds;
  Array<unsigned_int> exports;
  anon_class_8_1_8991fb9c _kjContextFunc2680;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2679:7)>
  _kjContext2680;
  uint local_14c;
  undefined1 local_148 [32];
  undefined1 local_128 [40];
  Array<unsigned_int> local_100;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2670:7)>
  local_e8;
  Array<int> local_c8;
  anon_class_8_1_8991fb9c local_b0;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_a8;
  Builder local_a0;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2679:7)>
  local_78;
  
  local_128._16_8_ = (int *)0x0;
  local_128._0_8_ = (int *)0x0;
  local_128._8_8_ = (RemoveConst<int> *)0x0;
  local_128._24_8_ = &kj::NullArrayDisposer::instance;
  this_00 = *(RpcConnectionState **)(in_RSI + 0x18);
  pMVar1 = *(Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> **)(in_RSI + 0x48);
  lVar2 = *(long *)(in_RSI + 0x50);
  rpc::Call::Builder::getParams(&local_a0,(Builder *)(in_RSI + 0x68));
  local_a8.ptr = (HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  payload._builder.capTable = local_a0._builder.capTable;
  payload._builder.segment = local_a0._builder.segment;
  payload._builder.data = local_a0._builder.data;
  payload._builder.pointers = local_a0._builder.pointers;
  payload._builder.dataSize = local_a0._builder.dataSize;
  payload._builder.pointerCount = local_a0._builder.pointerCount;
  payload._builder._38_2_ = local_a0._builder._38_2_;
  capTable.size_ = lVar2 - (long)pMVar1 >> 4;
  capTable.ptr = pMVar1;
  writeDescriptors(&local_100,this_00,capTable,payload,(Vector<int> *)local_128,&local_a8);
  plVar3 = *(long **)(in_RSI + 0x38);
  kj::Vector<int>::releaseAsArray(&local_c8,(Vector<int> *)local_128);
  (**(code **)(*plVar3 + 8))(plVar3,&local_c8);
  kj::Array<int>::~Array(&local_c8);
  lVar2 = *(long *)(in_RSI + 0x18);
  if (local_100.size_ != 0) {
    *(undefined1 *)(lVar2 + 0xb41) = 1;
  }
  this_01 = anon_unknown_18::
            ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::
            nextHigh((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>
                      *)(lVar2 + 0x248),&local_14c);
  this_01->isAwaitingReturn = false;
  kj::Array<unsigned_int>::operator=(&this_01->paramExports,&local_100);
  this_01->isTailCall = false;
  kj::
  refcounted<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,capnp::_::RpcSystemBase::RpcConnectionState&,unsigned_int&,kj::None_const&>
            ((RpcConnectionState *)local_148,*(uint **)(in_RSI + 0x18),(None *)&local_14c);
  (this_01->selfRef).ptr = (QuestionRef *)local_148._8_8_;
  kj::UnwindDetector::UnwindDetector((UnwindDetector *)(local_148 + 0x1c));
  local_e8.maybeFunc.ptr.isSet = true;
  puVar4 = *(uint **)(in_RSI + 0x78);
  *puVar4 = local_14c;
  puVar4 = puVar4 + 4;
  *(byte *)puVar4 = (byte)*puVar4 | 4;
  local_e8.maybeFunc.ptr.field_1.value._kjUnwindDetector2673 = (UnwindDetector *)(local_148 + 0x1c);
  local_e8.maybeFunc.ptr.field_1.value.question = this_01;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:2679:7)>
  ::ContextImpl(&local_78,&local_b0);
  (**(code **)(**(long **)(in_RSI + 0x38) + 0x10))();
  (this->super_RequestHook)._vptr_RequestHook = (_func_int **)local_148._0_8_;
  (this->super_RequestHook).brand = (void *)local_148._8_8_;
  local_148._8_8_ = (_func_int **)0x0;
  kj::_::Debug::Context::~Context(&local_78.super_Context);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:2670:7)>
  ::run(&local_e8);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::dispose
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             local_148);
  kj::Array<unsigned_int>::~Array(&local_100);
  kj::ArrayBuilder<int>::dispose((ArrayBuilder<int> *)local_128);
  OVar5.ptr = extraout_RDX;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

kj::Own<QuestionRef> sendForPipelineInternal() {
      // Since must of setupSend() is subtly different for this case, we don't reuse it.

      // Build the cap table.
      kj::Vector<int> fds;
      auto exports = connectionState->writeDescriptors(
          capTable.getTable(), callBuilder.getParams(), fds);
      message->setFds(fds.releaseAsArray());

      if (exports.size() > 0) {
        connectionState->sentCapabilitiesInPipelineOnlyCall = true;
      }

      // Init the question table.  Do this after writing descriptors to avoid interference.
      QuestionId questionId;
      auto& question = connectionState->questions.nextHigh(questionId);
      question.isAwaitingReturn = false;  // No Return needed
      question.paramExports = kj::mv(exports);
      question.isTailCall = false;

      // Make the QuestionRef and result promise.
      auto questionRef = kj::refcounted<QuestionRef>(*connectionState, questionId, kj::none);
      question.selfRef = *questionRef;

      // If sending throws, we'll need to fix up the state a little...
      KJ_ON_SCOPE_FAILURE({
        question.skipFinish = true;
        connectionState->releaseExports(question.paramExports);
      });

      // Finish and send.
      callBuilder.setQuestionId(questionId);
      callBuilder.setOnlyPromisePipeline(true);

      KJ_CONTEXT("sending RPC call",
          callBuilder.getInterfaceId(), callBuilder.getMethodId());
      message->send();

      return kj::mv(questionRef);
    }